

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::parseOnOff(char **token,bool default_value)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  byte local_21;
  bool ret;
  char *end;
  bool default_value_local;
  char **token_local;
  
  sVar3 = strspn(*token," \t");
  *token = *token + sVar3;
  pcVar1 = *token;
  sVar3 = strcspn(*token," \t\r");
  iVar2 = strncmp(*token,"on",2);
  if (iVar2 == 0) {
    local_21 = 1;
  }
  else {
    iVar2 = strncmp(*token,"off",3);
    local_21 = default_value;
    if (iVar2 == 0) {
      local_21 = 0;
    }
  }
  *token = pcVar1 + sVar3;
  return (bool)(local_21 & 1);
}

Assistant:

static inline bool parseOnOff(const char **token, bool default_value = true) {
  (*token) += strspn((*token), " \t");
  const char *end = (*token) + strcspn((*token), " \t\r");

  bool ret = default_value;
  if ((0 == strncmp((*token), "on", 2))) {
    ret = true;
  } else if ((0 == strncmp((*token), "off", 3))) {
    ret = false;
  }

  (*token) = end;
  return ret;
}